

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O3

void ncnn::pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  void **ppvVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int *piVar18;
  size_t sVar19;
  undefined8 uVar20;
  Mat *pMVar21;
  size_t *psVar22;
  long lVar23;
  undefined8 *puVar24;
  void *pvVar25;
  long lVar26;
  undefined1 (*pauVar27) [32];
  undefined1 (*pauVar28) [16];
  long lVar29;
  long lVar30;
  long lVar31;
  Mat *pMVar32;
  uint uVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  uint uVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  undefined1 (*pauVar48) [16];
  long lVar49;
  long lVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  long local_118;
  long local_108;
  long local_f8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  
  iVar37 = B->elempack;
  psVar22 = (size_t *)&B->w;
  if (B->dims == 3) {
    psVar22 = &B->cstep;
  }
  iVar8 = (int)*psVar22;
  lVar40 = 0;
  lVar50 = (long)k;
  lVar47 = (long)j;
  lVar36 = (long)iVar8;
  if (0xb < max_jj) {
    lVar23 = (long)(k * 4) * 4;
    lVar56 = lVar23 + lVar36 * lVar47 * 4;
    lVar39 = (lVar47 + 4) * lVar36;
    lVar53 = lVar23 + lVar39 * 4;
    lVar29 = (lVar47 + 8) * lVar36;
    lVar23 = lVar23 + lVar29 * 4;
    lVar42 = lVar50 * 4;
    lVar54 = lVar42 + lVar36 * lVar47 * 4;
    lVar26 = lVar36 * 0x30;
    lVar45 = lVar36 * 4;
    lVar41 = 0;
    lVar31 = 0;
    do {
      if (iVar37 == 8) {
        uVar33 = (int)lVar31 + j;
        uVar43 = (int)lVar31 + 7 + j;
        if (-1 < (int)uVar33) {
          uVar43 = uVar33;
        }
        uVar43 = uVar43 & 0xfffffff8;
        puVar24 = (undefined8 *)
                  ((long)B->data + (long)(k * 8) * 4 + (long)(int)(uVar43 * iVar8) * 4);
        pauVar28 = (undefined1 (*) [16])
                   ((long)B->data + (long)(k * 8) * 4 + (long)(int)((uVar43 + 8) * iVar8) * 4);
        iVar38 = max_kk;
        if (uVar33 == uVar43 && 0 < max_kk) {
          do {
            piVar18 = (int *)puVar24[1];
            sVar19 = puVar24[2];
            uVar20 = puVar24[3];
            BT->data = (void *)*puVar24;
            BT->refcount = piVar18;
            BT->elemsize = sVar19;
            *(undefined8 *)&BT->elempack = uVar20;
            *(undefined1 (*) [16])&BT->allocator = *pauVar28;
            BT = (Mat *)&BT->h;
            puVar24 = puVar24 + 4;
            pauVar28 = pauVar28 + 2;
            iVar38 = iVar38 + -1;
          } while (iVar38 != 0);
        }
        if (uVar33 - uVar43 == 4 && 0 < max_kk) {
          lVar40 = 0;
          iVar38 = max_kk;
          do {
            puVar2 = (undefined8 *)((long)puVar24 + lVar40 + 0x10);
            piVar18 = (int *)puVar2[1];
            BT->data = (void *)*puVar2;
            BT->refcount = piVar18;
            *(undefined1 (*) [32])&BT->elemsize = *(undefined1 (*) [32])(*pauVar28 + lVar40);
            BT = (Mat *)&BT->h;
            lVar40 = lVar40 + 0x20;
            iVar38 = iVar38 + -1;
          } while (iVar38 != 0);
        }
      }
      if (iVar37 == 4) {
        if (0 < max_kk) {
          pvVar25 = B->data;
          iVar38 = max_kk;
          do {
            piVar18 = (int *)((undefined8 *)((long)pvVar25 + lVar56))[1];
            BT->data = *(void **)((long)pvVar25 + lVar56);
            BT->refcount = piVar18;
            sVar19 = ((size_t *)((long)pvVar25 + lVar53))[1];
            BT->elemsize = *(size_t *)((long)pvVar25 + lVar53);
            *(size_t *)&BT->elempack = sVar19;
            *(undefined1 (*) [16])&BT->allocator = *(undefined1 (*) [16])((long)pvVar25 + lVar23);
            BT = (Mat *)&BT->h;
            pvVar25 = (void *)((long)pvVar25 + 0x10);
            iVar38 = iVar38 + -1;
          } while (iVar38 != 0);
          goto LAB_004d0dad;
        }
      }
      else {
LAB_004d0dad:
        if (iVar37 == 1) {
          pvVar25 = B->data;
          if (max_kk < 8) {
            uVar43 = 0;
            local_108 = (long)pvVar25 + lVar50 * 4 + (lVar31 + lVar47) * lVar36 * 4;
            lVar40 = (long)pvVar25 + lVar50 * 4 + (lVar31 + lVar47 + 1) * lVar36 * 4;
            local_d8 = (long)pvVar25 + lVar50 * 4 + (lVar31 + lVar47 + 2) * lVar36 * 4;
            lVar51 = (long)pvVar25 + lVar50 * 4 + (lVar31 + lVar47 + 3) * lVar36 * 4;
            lVar30 = (long)pvVar25 + lVar50 * 4 + (lVar31 + lVar47 + 4) * lVar36 * 4;
            lVar55 = (long)pvVar25 + lVar50 * 4 + (lVar31 + lVar47 + 5) * lVar36 * 4;
            local_e0 = (long)pvVar25 + lVar50 * 4 + (lVar31 + lVar47 + 6) * lVar36 * 4;
            local_118 = (long)pvVar25 + lVar50 * 4 + (lVar31 + lVar47 + 7) * lVar36 * 4;
            local_d0 = (long)pvVar25 + lVar50 * 4 + (lVar31 + lVar47 + 8) * lVar36 * 4;
            lVar49 = (long)pvVar25 + lVar50 * 4 + (lVar31 + lVar47 + 9) * lVar36 * 4;
            lVar46 = (long)pvVar25 + lVar50 * 4 + (lVar31 + lVar47 + 10) * lVar36 * 4;
            lVar34 = (long)pvVar25 + lVar50 * 4 + (lVar47 + lVar31 + 0xb) * lVar36 * 4;
          }
          else {
            lVar34 = (long)pvVar25 + lVar41;
            iVar38 = 7;
            do {
              lVar40 = lVar34 + lVar54;
              lVar51 = lVar40 + lVar36 * 8;
              auVar3 = *(undefined1 (*) [32])(lVar40 + lVar36 * 4);
              auVar58 = *(undefined1 (*) [32])(lVar40 + lVar36 * 8);
              auVar60 = *(undefined1 (*) [32])(lVar51 + lVar36 * 4);
              lVar30 = lVar36 * 8 + lVar51;
              auVar4 = *(undefined1 (*) [32])(lVar51 + lVar36 * 8);
              lVar40 = lVar30 + lVar36 * 4;
              auVar5 = *(undefined1 (*) [32])(lVar30 + lVar36 * 4);
              auVar63 = *(undefined1 (*) [32])(lVar45 + lVar40);
              lVar40 = lVar40 + lVar45;
              auVar6 = *(undefined1 (*) [32])(lVar45 + lVar40);
              lVar40 = lVar40 + lVar45;
              auVar7 = *(undefined1 (*) [32])(lVar45 + lVar40);
              lVar40 = lVar40 + lVar45;
              auVar72 = *(undefined1 (*) [32])(lVar45 + lVar40);
              lVar40 = lVar40 + lVar45;
              auVar65 = *(undefined1 (*) [32])(lVar45 + lVar40);
              auVar66 = *(undefined1 (*) [32])(lVar40 + lVar36 * 8);
              auVar69 = vunpcklps_avx(*(undefined1 (*) [32])(lVar34 + lVar54),auVar3);
              auVar68 = vunpckhps_avx(*(undefined1 (*) [32])(lVar34 + lVar54),auVar3);
              auVar3 = vunpcklps_avx(auVar58,auVar60);
              auVar58 = vunpckhps_avx(auVar58,auVar60);
              auVar60 = vunpcklps_avx(auVar4,auVar5);
              auVar4 = vunpckhps_avx(auVar4,auVar5);
              auVar70 = vunpcklps_avx(auVar63,auVar6);
              auVar5 = vunpckhps_avx(auVar63,auVar6);
              auVar16 = vunpcklps_avx(auVar7,auVar72);
              auVar63 = vunpckhps_avx(auVar7,auVar72);
              auVar17 = vunpcklps_avx(auVar65,auVar66);
              auVar6 = vunpckhps_avx(auVar65,auVar66);
              auVar7 = vunpcklpd_avx(auVar69,auVar3);
              auVar3 = vunpckhpd_avx(auVar69,auVar3);
              auVar72 = vunpcklpd_avx(auVar68,auVar58);
              auVar58 = vunpckhpd_avx(auVar68,auVar58);
              auVar65 = vunpcklpd_avx(auVar60,auVar70);
              auVar60 = vunpckhpd_avx(auVar60,auVar70);
              auVar66 = vunpcklpd_avx(auVar4,auVar5);
              auVar4 = vunpckhpd_avx(auVar4,auVar5);
              auVar68 = vunpcklpd_avx(auVar16,auVar17);
              auVar5 = vunpckhpd_avx(auVar16,auVar17);
              auVar69 = vunpcklpd_avx(auVar63,auVar6);
              auVar63 = vunpckhpd_avx(auVar63,auVar6);
              auVar59 = auVar65._0_16_;
              auVar6 = vperm2f128_avx(auVar7,auVar65,0x31);
              auVar64 = auVar68._0_16_;
              auVar57 = auVar3._0_16_;
              auVar3 = vperm2f128_avx(auVar68,auVar3,0x31);
              auVar65._16_16_ = auVar5._0_16_;
              auVar65._0_16_ = auVar60._0_16_;
              auVar60 = vperm2f128_avx(auVar60,auVar5,0x31);
              auVar71 = auVar72._0_16_;
              auVar62 = auVar66._0_16_;
              auVar5 = vperm2f128_avx(auVar72,auVar66,0x31);
              auVar72._16_16_ = auVar58._0_16_;
              auVar72._0_16_ = auVar69._0_16_;
              auVar58 = vperm2f128_avx(auVar69,auVar58,0x31);
              auVar61 = auVar4._0_16_;
              auVar67 = auVar63._0_16_;
              auVar4 = vperm2f128_avx(auVar4,auVar63,0x31);
              BT->data = (void *)SUB168(auVar7._0_16_,0);
              BT->refcount = (int *)SUB168(auVar7._0_16_,8);
              BT->elemsize = auVar59._0_8_;
              BT->elempack = auVar59._8_4_;
              *(int *)&BT->field_0x1c = auVar59._12_4_;
              BT->allocator = (Allocator *)auVar64._0_8_;
              BT->dims = auVar64._8_4_;
              BT->w = auVar64._12_4_;
              BT->h = auVar57._0_4_;
              BT->d = auVar57._4_4_;
              BT->c = auVar57._8_4_;
              *(int *)&BT->field_0x3c = auVar57._12_4_;
              *(undefined1 (*) [32])&BT->cstep = auVar65;
              BT[1].elempack = auVar71._0_4_;
              *(int *)&BT[1].field_0x1c = auVar71._4_4_;
              BT[1].allocator = (Allocator *)auVar71._8_8_;
              BT[1].dims = auVar62._0_4_;
              BT[1].w = auVar62._4_4_;
              BT[1].h = auVar62._8_4_;
              BT[1].d = auVar62._12_4_;
              *(undefined1 (*) [32])&BT[1].c = auVar72;
              BT[2].elemsize = auVar61._0_8_;
              BT[2].elempack = auVar61._8_4_;
              *(int *)&BT[2].field_0x1c = auVar61._12_4_;
              BT[2].allocator = (Allocator *)auVar67._0_8_;
              BT[2].dims = auVar67._8_4_;
              BT[2].w = auVar67._12_4_;
              *(undefined1 (*) [32])&BT[2].h = auVar6;
              BT[3].refcount = (int *)auVar3._0_8_;
              BT[3].elemsize = auVar3._8_8_;
              BT[3].elempack = auVar3._16_4_;
              *(int *)&BT[3].field_0x1c = auVar3._20_4_;
              BT[3].allocator = (Allocator *)auVar3._24_8_;
              BT[3].dims = auVar60._0_4_;
              BT[3].w = auVar60._4_4_;
              BT[3].h = auVar60._8_4_;
              BT[3].d = auVar60._12_4_;
              BT[3].c = auVar60._16_4_;
              *(int *)&BT[3].field_0x3c = auVar60._20_4_;
              BT[3].cstep = auVar60._24_8_;
              BT[4].data = (void *)auVar5._0_8_;
              BT[4].refcount = (int *)auVar5._8_8_;
              BT[4].elemsize = auVar5._16_8_;
              BT[4].elempack = auVar5._24_4_;
              *(int *)&BT[4].field_0x1c = auVar5._28_4_;
              BT[4].allocator = (Allocator *)auVar58._0_8_;
              BT[4].dims = auVar58._8_4_;
              BT[4].w = auVar58._12_4_;
              BT[4].h = auVar58._16_4_;
              BT[4].d = auVar58._20_4_;
              BT[4].c = auVar58._24_4_;
              *(int *)&BT[4].field_0x3c = auVar58._28_4_;
              *(undefined1 (*) [32])&BT[4].cstep = auVar4;
              BT = (Mat *)&BT[5].elempack;
              lVar34 = lVar34 + 0x20;
              iVar38 = iVar38 + 8;
            } while (iVar38 < max_kk);
            local_108 = lVar34 + lVar54;
            lVar40 = lVar34 + lVar42 + (lVar47 + 1) * lVar36 * 4;
            local_d8 = lVar42 + (lVar47 + 2) * lVar36 * 4 + lVar34;
            lVar51 = lVar34 + lVar42 + (lVar47 + 3) * lVar36 * 4;
            lVar30 = lVar34 + lVar42 + lVar39 * 4;
            lVar55 = lVar34 + lVar42 + (lVar47 + 5) * lVar36 * 4;
            local_e0 = lVar34 + lVar42 + (lVar47 + 6) * lVar36 * 4;
            local_118 = lVar34 + lVar42 + (lVar47 + 7) * lVar36 * 4;
            local_d0 = lVar34 + lVar42 + lVar29 * 4;
            lVar49 = lVar34 + lVar42 + (lVar47 + 9) * lVar36 * 4;
            lVar46 = lVar34 + lVar42 + (lVar47 + 10) * lVar36 * 4;
            lVar34 = lVar34 + lVar42 + (lVar47 + 0xb) * lVar36 * 4;
            uVar43 = max_kk & 0xfffffff8;
          }
          if ((int)(uVar43 | 3) < max_kk) {
            lVar44 = 0;
            uVar33 = uVar43;
            do {
              auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(local_108 + lVar44),
                                      *(undefined1 (*) [16])(lVar40 + lVar44));
              auVar64 = vunpcklps_avx(*(undefined1 (*) [16])(local_d8 + lVar44),
                                      *(undefined1 (*) [16])(lVar51 + lVar44));
              auVar61 = vunpckhps_avx(*(undefined1 (*) [16])(local_108 + lVar44),
                                      *(undefined1 (*) [16])(lVar40 + lVar44));
              auVar62 = vunpckhps_avx(*(undefined1 (*) [16])(local_d8 + lVar44),
                                      *(undefined1 (*) [16])(lVar51 + lVar44));
              auVar57 = vmovlhps_avx(auVar59,auVar64);
              auVar71 = vunpckhpd_avx(auVar59,auVar64);
              auVar59 = vmovlhps_avx(auVar61,auVar62);
              auVar10 = vunpckhpd_avx(auVar61,auVar62);
              auVar62 = vunpcklps_avx(*(undefined1 (*) [16])(lVar30 + lVar44),
                                      *(undefined1 (*) [16])(lVar55 + lVar44));
              auVar14 = vunpcklps_avx(*(undefined1 (*) [16])(local_e0 + lVar44),
                                      *(undefined1 (*) [16])(local_118 + lVar44));
              auVar64 = vunpckhps_avx(*(undefined1 (*) [16])(lVar30 + lVar44),
                                      *(undefined1 (*) [16])(lVar55 + lVar44));
              auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(local_e0 + lVar44),
                                      *(undefined1 (*) [16])(local_118 + lVar44));
              auVar61 = vmovlhps_avx(auVar62,auVar14);
              auVar14 = vunpckhpd_avx(auVar62,auVar14);
              auVar62 = vmovlhps_avx(auVar64,auVar67);
              auVar11 = vunpckhpd_avx(auVar64,auVar67);
              auVar67 = vunpcklps_avx(*(undefined1 (*) [16])(local_d0 + lVar44),
                                      *(undefined1 (*) [16])(lVar49 + lVar44));
              auVar15 = vunpcklps_avx(*(undefined1 (*) [16])(lVar46 + lVar44),
                                      *(undefined1 (*) [16])(lVar34 + lVar44));
              auVar12 = vunpckhps_avx(*(undefined1 (*) [16])(local_d0 + lVar44),
                                      *(undefined1 (*) [16])(lVar49 + lVar44));
              auVar13 = vunpckhps_avx(*(undefined1 (*) [16])(lVar46 + lVar44),
                                      *(undefined1 (*) [16])(lVar34 + lVar44));
              auVar64 = vmovlhps_avx(auVar67,auVar15);
              auVar15 = vunpckhpd_avx(auVar67,auVar15);
              auVar67 = vmovlhps_avx(auVar12,auVar13);
              auVar12 = vunpckhpd_avx(auVar12,auVar13);
              BT->data = (void *)auVar57._0_8_;
              BT->refcount = (int *)auVar57._8_8_;
              BT->elemsize = auVar61._0_8_;
              BT->elempack = auVar61._8_4_;
              *(int *)&BT->field_0x1c = auVar61._12_4_;
              BT->allocator = (Allocator *)auVar64._0_8_;
              BT->dims = auVar64._8_4_;
              BT->w = auVar64._12_4_;
              BT->h = auVar71._0_4_;
              BT->d = auVar71._4_4_;
              BT->c = auVar71._8_4_;
              *(int *)&BT->field_0x3c = auVar71._12_4_;
              *(undefined1 (*) [16])&BT->cstep = auVar14;
              BT[1].refcount = (int *)auVar15._0_8_;
              BT[1].elemsize = auVar15._8_8_;
              BT[1].elempack = auVar59._0_4_;
              *(int *)&BT[1].field_0x1c = auVar59._4_4_;
              BT[1].allocator = (Allocator *)auVar59._8_8_;
              BT[1].dims = auVar62._0_4_;
              BT[1].w = auVar62._4_4_;
              BT[1].h = auVar62._8_4_;
              BT[1].d = auVar62._12_4_;
              BT[1].c = auVar67._0_4_;
              *(int *)&BT[1].field_0x3c = auVar67._4_4_;
              BT[1].cstep = auVar67._8_8_;
              BT[2].data = (void *)auVar10._0_8_;
              BT[2].refcount = (int *)auVar10._8_8_;
              BT[2].elemsize = auVar11._0_8_;
              BT[2].elempack = auVar11._8_4_;
              *(int *)&BT[2].field_0x1c = auVar11._12_4_;
              BT[2].allocator = (Allocator *)auVar12._0_8_;
              BT[2].dims = auVar12._8_4_;
              BT[2].w = auVar12._12_4_;
              BT = (Mat *)&BT[2].h;
              uVar43 = uVar33 + 4;
              lVar44 = lVar44 + 0x10;
              iVar38 = uVar33 + 7;
              uVar33 = uVar43;
            } while (iVar38 < max_kk);
            local_108 = local_108 + lVar44;
            lVar40 = lVar40 + lVar44;
            local_d8 = local_d8 + lVar44;
            lVar51 = lVar51 + lVar44;
            lVar30 = lVar30 + lVar44;
            lVar55 = lVar55 + lVar44;
            local_e0 = local_e0 + lVar44;
            local_118 = local_118 + lVar44;
            local_d0 = local_d0 + lVar44;
            lVar49 = lVar49 + lVar44;
            lVar46 = lVar46 + lVar44;
            lVar34 = lVar34 + lVar44;
          }
          if ((int)uVar43 < max_kk) {
            lVar44 = 0;
            do {
              *(int *)&BT->data = *(int *)(local_108 + lVar44 * 4);
              *(int *)((long)&BT->data + 4) = *(int *)(lVar40 + lVar44 * 4);
              *(int *)&BT->refcount = *(int *)(local_d8 + lVar44 * 4);
              *(undefined4 *)((long)&BT->refcount + 4) = *(undefined4 *)(lVar51 + lVar44 * 4);
              *(undefined4 *)&BT->elemsize = *(undefined4 *)(lVar30 + lVar44 * 4);
              *(undefined4 *)((long)&BT->elemsize + 4) = *(undefined4 *)(lVar55 + lVar44 * 4);
              BT->elempack = *(int *)(local_e0 + lVar44 * 4);
              *(undefined4 *)&BT->field_0x1c = *(undefined4 *)(local_118 + lVar44 * 4);
              *(undefined4 *)&BT->allocator = *(undefined4 *)(local_d0 + lVar44 * 4);
              *(undefined4 *)((long)&BT->allocator + 4) = *(undefined4 *)(lVar49 + lVar44 * 4);
              BT->dims = *(int *)(lVar46 + lVar44 * 4);
              BT->w = *(int *)(lVar34 + lVar44 * 4);
              BT = (Mat *)&BT->h;
              lVar44 = lVar44 + 1;
            } while (max_kk - uVar43 != (int)lVar44);
          }
        }
      }
      lVar40 = lVar31 + 0xc;
      uVar52 = lVar31 + 0x17;
      lVar56 = lVar56 + lVar26;
      lVar53 = lVar53 + lVar26;
      lVar23 = lVar23 + lVar26;
      lVar41 = lVar41 + lVar26;
      lVar31 = lVar40;
    } while (uVar52 < (uint)max_jj);
  }
  lVar56 = (long)max_jj;
  if ((int)lVar40 + 7 < max_jj) {
    lVar26 = (long)(int)lVar40;
    lVar40 = (lVar26 + lVar47) * lVar36;
    lVar23 = (long)(k * 4) * 4;
    lVar53 = lVar23 + lVar40 * 4;
    lVar42 = (lVar26 + lVar47 + 4) * lVar36;
    lVar23 = lVar23 + lVar42 * 4;
    lVar45 = lVar50 * 4;
    lVar54 = lVar45 + (lVar26 + lVar47 + 7) * lVar36 * 4;
    local_f8 = lVar45 + (lVar26 + lVar47 + 6) * lVar36 * 4;
    local_c0 = lVar45 + (lVar26 + lVar47 + 5) * lVar36 * 4;
    lVar42 = lVar45 + lVar42 * 4;
    local_c8 = lVar45 + (lVar26 + lVar47 + 3) * lVar36 * 4;
    local_108 = lVar45 + (lVar26 + lVar47 + 2) * lVar36 * 4;
    local_d8 = lVar45 + (lVar26 + lVar47 + 1) * lVar36 * 4;
    lVar45 = lVar45 + lVar40 * 4;
    lVar31 = lVar36 * 0x20;
    do {
      if (iVar37 == 8) {
        iVar38 = (int)lVar26;
        uVar33 = iVar38 + j;
        uVar43 = iVar38 + 7 + j;
        if (-1 < (int)uVar33) {
          uVar43 = uVar33;
        }
        pvVar25 = B->data;
        pauVar27 = (undefined1 (*) [32])
                   ((long)pvVar25 + (long)(k * 8) * 4 + (long)(((int)uVar43 >> 3) * iVar8 * 8) * 4);
        iVar35 = j + iVar38 + 8;
        iVar38 = j + iVar38 + 0xf;
        if (-1 < iVar35) {
          iVar38 = iVar35;
        }
        iVar35 = max_kk;
        if (uVar33 == (uVar43 & 0xfffffff8) && 0 < max_kk) {
          do {
            *(undefined1 (*) [32])BT = *pauVar27;
            BT = (Mat *)&BT->allocator;
            pauVar27 = pauVar27 + 1;
            iVar35 = iVar35 + -1;
          } while (iVar35 != 0);
        }
        if (uVar33 - (uVar43 & 0xfffffff8) == 4 && 0 < max_kk) {
          lVar40 = 0;
          iVar35 = max_kk;
          do {
            lVar29 = lVar40;
            uVar20 = *(undefined8 *)((long)(*pauVar27 + lVar29 + 0x10) + 8);
            puVar24 = (undefined8 *)((long)&BT->data + lVar29);
            *puVar24 = *(undefined8 *)(*pauVar27 + lVar29 + 0x10);
            puVar24[1] = uVar20;
            *(undefined1 (*) [16])((long)&BT->elemsize + lVar29) =
                 *(undefined1 (*) [16])
                  ((long)pvVar25 +
                  lVar29 + (long)(k * 8) * 4 + (long)((iVar38 >> 3) * iVar8 * 8) * 4);
            iVar35 = iVar35 + -1;
            lVar40 = lVar29 + 0x20;
          } while (iVar35 != 0);
          BT = (Mat *)((long)&BT->allocator + lVar29);
        }
      }
      if (iVar37 == 4) {
        if (0 < max_kk) {
          pvVar25 = B->data;
          iVar38 = max_kk;
          do {
            piVar18 = (int *)((undefined8 *)((long)pvVar25 + lVar53))[1];
            BT->data = *(void **)((long)pvVar25 + lVar53);
            BT->refcount = piVar18;
            *(undefined1 (*) [16])&BT->elemsize = *(undefined1 (*) [16])((long)pvVar25 + lVar23);
            BT = (Mat *)&BT->allocator;
            pvVar25 = (void *)((long)pvVar25 + 0x10);
            iVar38 = iVar38 + -1;
          } while (iVar38 != 0);
          goto LAB_004d1713;
        }
      }
      else {
LAB_004d1713:
        if (iVar37 == 1) {
          pvVar25 = B->data;
          if (max_kk < 8) {
            uVar43 = 0;
            lVar40 = lVar50 * 4 + (lVar47 + lVar26) * lVar36 * 4;
            lVar49 = lVar50 * 4 + (lVar47 + lVar26 + 1) * lVar36 * 4;
            lVar55 = lVar50 * 4 + (lVar47 + lVar26 + 2) * lVar36 * 4;
            lVar30 = lVar50 * 4 + (lVar47 + lVar26 + 3) * lVar36 * 4;
            lVar51 = lVar50 * 4 + (lVar47 + lVar26 + 4) * lVar36 * 4;
            lVar41 = lVar50 * 4 + (lVar47 + lVar26 + 5) * lVar36 * 4;
            lVar39 = lVar50 * 4 + (lVar47 + lVar26 + 6) * lVar36 * 4;
            lVar29 = lVar50 * 4 + (lVar47 + lVar26 + 7) * lVar36 * 4;
          }
          else {
            iVar38 = 7;
            lVar40 = 0;
            pMVar21 = BT;
            do {
              pMVar32 = pMVar21;
              ppvVar1 = &BT->data + lVar40;
              lVar29 = lVar40 + lVar45;
              auVar3 = *(undefined1 (*) [32])((long)pvVar25 + lVar40 + lVar45);
              lVar39 = lVar36 * 8 + lVar29;
              auVar58 = *(undefined1 (*) [32])((long)pvVar25 + lVar36 * 4 + lVar29);
              auVar60 = *(undefined1 (*) [32])((long)pvVar25 + lVar36 * 8 + lVar29);
              auVar4 = *(undefined1 (*) [32])((long)pvVar25 + lVar36 * 4 + lVar39);
              lVar29 = lVar36 * 8 + lVar39;
              auVar5 = *(undefined1 (*) [32])((long)pvVar25 + lVar36 * 8 + lVar39);
              lVar39 = lVar36 * 4 + lVar29;
              auVar63 = *(undefined1 (*) [32])((long)pvVar25 + lVar36 * 4 + lVar29);
              auVar6 = *(undefined1 (*) [32])((long)pvVar25 + lVar36 * 4 + lVar39);
              auVar7 = *(undefined1 (*) [32])((long)pvVar25 + lVar36 * 8 + lVar39);
              auVar72 = vunpcklps_avx(auVar3,auVar58);
              auVar58 = vunpckhps_avx(auVar3,auVar58);
              auVar3 = vunpcklps_avx(auVar60,auVar4);
              auVar60 = vunpckhps_avx(auVar60,auVar4);
              auVar65 = vunpcklps_avx(auVar5,auVar63);
              auVar4 = vunpckhps_avx(auVar5,auVar63);
              auVar66 = vunpcklps_avx(auVar6,auVar7);
              auVar5 = vunpckhps_avx(auVar6,auVar7);
              auVar63 = vunpcklpd_avx(auVar72,auVar3);
              auVar3 = vunpckhpd_avx(auVar72,auVar3);
              auVar6 = vunpcklpd_avx(auVar58,auVar60);
              auVar58 = vunpckhpd_avx(auVar58,auVar60);
              auVar7 = vunpcklpd_avx(auVar65,auVar66);
              auVar60 = vunpckhpd_avx(auVar65,auVar66);
              auVar72 = vunpcklpd_avx(auVar4,auVar5);
              auVar4 = vunpckhpd_avx(auVar4,auVar5);
              auVar66._16_16_ = auVar7._0_16_;
              auVar66._0_16_ = auVar63._0_16_;
              auVar68._16_16_ = auVar60._0_16_;
              auVar68._0_16_ = auVar3._0_16_;
              auVar69._16_16_ = auVar72._0_16_;
              auVar69._0_16_ = auVar6._0_16_;
              auVar70._16_16_ = auVar4._0_16_;
              auVar70._0_16_ = auVar58._0_16_;
              auVar5 = vperm2f128_avx(auVar63,auVar7,0x31);
              auVar3 = vperm2f128_avx(auVar3,auVar60,0x31);
              auVar60 = vperm2f128_avx(auVar6,auVar72,0x31);
              auVar58 = vperm2f128_avx(auVar58,auVar4,0x31);
              *(undefined1 (*) [32])ppvVar1 = auVar66;
              *(undefined1 (*) [32])(ppvVar1 + 4) = auVar68;
              *(undefined1 (*) [32])(ppvVar1 + 8) = auVar69;
              *(undefined1 (*) [32])(ppvVar1 + 0xc) = auVar70;
              *(undefined1 (*) [32])(ppvVar1 + 0x10) = auVar5;
              *(undefined1 (*) [32])(ppvVar1 + 0x14) = auVar3;
              *(undefined1 (*) [32])(ppvVar1 + 0x18) = auVar60;
              *(undefined1 (*) [32])(ppvVar1 + 0x1c) = auVar58;
              lVar40 = lVar40 + 0x20;
              iVar38 = iVar38 + 8;
              pMVar21 = (Mat *)(ppvVar1 + 0x20);
            } while (iVar38 < max_kk);
            BT = (Mat *)&pMVar32[3].dims;
            lVar29 = lVar40 + lVar54;
            lVar39 = lVar40 + local_f8;
            lVar41 = lVar40 + local_c0;
            lVar51 = lVar40 + lVar42;
            lVar30 = lVar40 + local_c8;
            lVar55 = lVar40 + local_108;
            lVar49 = lVar40 + local_d8;
            lVar40 = lVar40 + lVar45;
            uVar43 = max_kk & 0xfffffff8;
          }
          lVar51 = (long)pvVar25 + lVar51;
          lVar39 = (long)pvVar25 + lVar39;
          lVar49 = (long)pvVar25 + lVar49;
          lVar40 = (long)pvVar25 + lVar40;
          lVar30 = (long)pvVar25 + lVar30;
          lVar55 = (long)pvVar25 + lVar55;
          lVar41 = (long)pvVar25 + lVar41;
          lVar29 = (long)pvVar25 + lVar29;
          if ((int)(uVar43 | 3) < max_kk) {
            lVar34 = 0;
            lVar46 = 0;
            uVar33 = uVar43;
            do {
              lVar44 = lVar46;
              auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(lVar40 + lVar34),
                                      *(undefined1 (*) [16])(lVar49 + lVar34));
              auVar64 = vunpcklps_avx(*(undefined1 (*) [16])(lVar55 + lVar34),
                                      *(undefined1 (*) [16])(lVar30 + lVar34));
              auVar61 = vunpckhps_avx(*(undefined1 (*) [16])(lVar40 + lVar34),
                                      *(undefined1 (*) [16])(lVar49 + lVar34));
              auVar62 = vunpckhps_avx(*(undefined1 (*) [16])(lVar55 + lVar34),
                                      *(undefined1 (*) [16])(lVar30 + lVar34));
              auVar57 = vmovlhps_avx(auVar59,auVar64);
              auVar64 = vunpckhpd_avx(auVar59,auVar64);
              auVar59 = vmovlhps_avx(auVar61,auVar62);
              auVar67 = vunpckhpd_avx(auVar61,auVar62);
              auVar62 = vunpcklps_avx(*(undefined1 (*) [16])(lVar51 + lVar34),
                                      *(undefined1 (*) [16])(lVar41 + lVar34));
              auVar71 = vunpcklps_avx(*(undefined1 (*) [16])(lVar39 + lVar34),
                                      *(undefined1 (*) [16])(lVar29 + lVar34));
              auVar10 = vunpckhps_avx(*(undefined1 (*) [16])(lVar51 + lVar34),
                                      *(undefined1 (*) [16])(lVar41 + lVar34));
              auVar14 = vunpckhps_avx(*(undefined1 (*) [16])(lVar39 + lVar34),
                                      *(undefined1 (*) [16])(lVar29 + lVar34));
              auVar61 = vmovlhps_avx(auVar62,auVar71);
              auVar71 = vunpckhpd_avx(auVar62,auVar71);
              auVar62 = vmovlhps_avx(auVar10,auVar14);
              auVar10 = vunpckhpd_avx(auVar10,auVar14);
              *(undefined1 (*) [16])(&BT->data + lVar34) = auVar57;
              *(undefined1 (*) [16])(&BT->elemsize + lVar34) = auVar61;
              *(undefined1 (*) [16])(&BT->allocator + lVar34) = auVar64;
              *(undefined1 (*) [16])(&BT->h + lVar34 * 2) = auVar71;
              *(undefined1 (*) [16])(&BT->cstep + lVar34) = auVar59;
              *(undefined1 (*) [16])(&BT[1].refcount + lVar34) = auVar62;
              *(undefined1 (*) [16])(&BT[1].elempack + lVar34 * 2) = auVar67;
              *(undefined1 (*) [16])(&BT[1].dims + lVar34 * 2) = auVar10;
              uVar43 = uVar33 + 4;
              lVar34 = lVar34 + 0x10;
              iVar38 = uVar33 + 7;
              lVar46 = lVar44 + 0x80;
              uVar33 = uVar43;
            } while (iVar38 < max_kk);
            BT = (Mat *)((long)&BT[1].c + lVar44);
            lVar29 = lVar29 + lVar34;
            lVar39 = lVar39 + lVar34;
            lVar41 = lVar41 + lVar34;
            lVar51 = lVar51 + lVar34;
            lVar30 = lVar30 + lVar34;
            lVar55 = lVar55 + lVar34;
            lVar49 = lVar49 + lVar34;
            lVar40 = lVar40 + lVar34;
          }
          iVar38 = max_kk - uVar43;
          if (iVar38 != 0 && (int)uVar43 <= max_kk) {
            lVar46 = 0;
            lVar34 = 0;
            do {
              *(undefined4 *)(&BT->data + lVar34) = *(undefined4 *)(lVar40 + lVar34);
              *(undefined4 *)((long)&BT->data + lVar34 * 8 + 4) = *(undefined4 *)(lVar49 + lVar34);
              *(undefined4 *)(&BT->refcount + lVar34) = *(undefined4 *)(lVar55 + lVar34);
              *(undefined4 *)((long)&BT->refcount + lVar34 * 8 + 4) =
                   *(undefined4 *)(lVar30 + lVar34);
              *(undefined4 *)(&BT->elemsize + lVar34) = *(undefined4 *)(lVar51 + lVar34);
              *(undefined4 *)((long)&BT->elemsize + lVar34 * 8 + 4) =
                   *(undefined4 *)(lVar41 + lVar34);
              (&BT->elempack)[lVar34 * 2] = *(int *)(lVar39 + lVar34);
              *(undefined4 *)(&BT->field_0x1c + lVar34 * 8) = *(undefined4 *)(lVar29 + lVar34);
              lVar34 = lVar34 + 4;
              lVar46 = lVar46 + -0x20;
              iVar38 = iVar38 + -1;
            } while (iVar38 != 0);
            BT = (Mat *)((long)BT - lVar46);
          }
        }
      }
      lVar40 = lVar26 + 8;
      lVar53 = lVar53 + lVar31;
      lVar23 = lVar23 + lVar31;
      lVar54 = lVar54 + lVar31;
      local_f8 = local_f8 + lVar31;
      local_c0 = local_c0 + lVar31;
      lVar42 = lVar42 + lVar31;
      local_c8 = local_c8 + lVar31;
      local_108 = local_108 + lVar31;
      local_d8 = local_d8 + lVar31;
      lVar45 = lVar45 + lVar31;
      bVar9 = lVar26 < lVar56 + -0xf;
      lVar26 = lVar40;
    } while (bVar9);
  }
  if ((int)((uint)lVar40 | 3) < max_jj) {
    lVar45 = (long)(int)(uint)lVar40;
    lVar42 = lVar50 * 4;
    lVar53 = lVar42 + (lVar45 + lVar47 + 3) * lVar36 * 4;
    lVar26 = lVar36 * 0x10;
    lVar23 = lVar42 + (lVar45 + lVar47 + 2) * lVar36 * 4;
    lVar54 = lVar42 + (lVar45 + lVar47 + 1) * lVar36 * 4;
    lVar42 = lVar42 + (lVar45 + lVar47) * lVar36 * 4;
    do {
      if (iVar37 == 8) {
        uVar33 = (int)lVar45 + j;
        uVar43 = (int)lVar45 + 7 + j;
        if (-1 < (int)uVar33) {
          uVar43 = uVar33;
        }
        pauVar28 = (undefined1 (*) [16])
                   ((long)B->data + (long)(k * 8) * 4 + (long)(((int)uVar43 >> 3) * iVar8 * 8) * 4);
        iVar38 = max_kk;
        if (uVar33 == (uVar43 & 0xfffffff8) && 0 < max_kk) {
          do {
            *(undefined1 (*) [16])BT = *pauVar28;
            BT = (Mat *)&BT->elemsize;
            pauVar28 = pauVar28 + 2;
            iVar38 = iVar38 + -1;
          } while (iVar38 != 0);
        }
        if (uVar33 - (uVar43 & 0xfffffff8) == 4 && 0 < max_kk) {
          pauVar28 = pauVar28 + 1;
          iVar38 = max_kk;
          do {
            *(undefined1 (*) [16])BT = *pauVar28;
            BT = (Mat *)&BT->elemsize;
            pauVar28 = pauVar28 + 2;
            iVar38 = iVar38 + -1;
          } while (iVar38 != 0);
        }
      }
      if (iVar37 == 4) {
        if (0 < max_kk) {
          pauVar28 = (undefined1 (*) [16])
                     ((long)B->data + (long)(k * 4) * 4 + (lVar47 + lVar45) * lVar36 * 4);
          iVar38 = max_kk;
          do {
            *(undefined1 (*) [16])BT = *pauVar28;
            BT = (Mat *)&BT->elemsize;
            pauVar28 = pauVar28 + 1;
            iVar38 = iVar38 + -1;
          } while (iVar38 != 0);
          goto LAB_004d1ccb;
        }
      }
      else {
LAB_004d1ccb:
        if (iVar37 == 1) {
          pvVar25 = B->data;
          if (max_kk < 8) {
            uVar43 = 0;
            lVar39 = lVar50 * 4 + (lVar47 + lVar45) * lVar36 * 4;
            lVar29 = lVar50 * 4 + (lVar47 + lVar45 + 1) * lVar36 * 4;
            lVar31 = lVar50 * 4 + (lVar47 + lVar45 + 2) * lVar36 * 4;
            lVar40 = lVar50 * 4 + (lVar47 + lVar45 + 3) * lVar36 * 4;
          }
          else {
            iVar38 = 7;
            lVar39 = 0;
            pMVar21 = BT;
            do {
              pMVar32 = pMVar21;
              pauVar27 = (undefined1 (*) [32])((long)&BT->data + lVar39 * 4);
              auVar3 = *(undefined1 (*) [32])((long)pvVar25 + lVar39 + lVar42);
              auVar58 = *(undefined1 (*) [32])((long)pvVar25 + lVar39 + lVar54);
              auVar60 = *(undefined1 (*) [32])((long)pvVar25 + lVar39 + lVar23);
              auVar4 = *(undefined1 (*) [32])((long)pvVar25 + lVar39 + lVar53);
              auVar5 = vunpcklps_avx(auVar3,auVar58);
              auVar58 = vunpckhps_avx(auVar3,auVar58);
              auVar3 = vunpcklps_avx(auVar60,auVar4);
              auVar60 = vunpckhps_avx(auVar60,auVar4);
              auVar4 = vunpcklpd_avx(auVar5,auVar3);
              auVar3 = vunpckhpd_avx(auVar5,auVar3);
              auVar5 = vunpcklpd_avx(auVar58,auVar60);
              auVar58 = vunpckhpd_avx(auVar58,auVar60);
              auVar60._16_16_ = auVar3._0_16_;
              auVar60._0_16_ = auVar4._0_16_;
              auVar63._16_16_ = auVar58._0_16_;
              auVar63._0_16_ = auVar5._0_16_;
              auVar3 = vperm2f128_avx(auVar4,auVar3,0x31);
              auVar58 = vperm2f128_avx(auVar5,auVar58,0x31);
              *pauVar27 = auVar60;
              pauVar27[1] = auVar63;
              pauVar27[2] = auVar3;
              pauVar27[3] = auVar58;
              lVar39 = lVar39 + 0x20;
              iVar38 = iVar38 + 8;
              pMVar21 = (Mat *)(pauVar27 + 4);
            } while (iVar38 < max_kk);
            BT = (Mat *)&pMVar32[1].c;
            lVar40 = lVar39 + lVar53;
            lVar31 = lVar39 + lVar23;
            lVar29 = lVar39 + lVar54;
            lVar39 = lVar39 + lVar42;
            uVar43 = max_kk & 0xfffffff8;
          }
          lVar31 = (long)pvVar25 + lVar31;
          lVar40 = (long)pvVar25 + lVar40;
          lVar39 = (long)pvVar25 + lVar39;
          lVar29 = (long)pvVar25 + lVar29;
          if ((int)(uVar43 | 3) < max_kk) {
            lVar41 = 0;
            pMVar21 = BT;
            uVar33 = uVar43;
            do {
              pMVar32 = pMVar21;
              auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(lVar39 + lVar41),
                                      *(undefined1 (*) [16])(lVar29 + lVar41));
              auVar61 = vunpcklps_avx(*(undefined1 (*) [16])(lVar31 + lVar41),
                                      *(undefined1 (*) [16])(lVar40 + lVar41));
              auVar62 = vunpckhps_avx(*(undefined1 (*) [16])(lVar39 + lVar41),
                                      *(undefined1 (*) [16])(lVar29 + lVar41));
              auVar64 = vunpckhps_avx(*(undefined1 (*) [16])(lVar31 + lVar41),
                                      *(undefined1 (*) [16])(lVar40 + lVar41));
              auVar57 = vmovlhps_avx(auVar59,auVar61);
              auVar61 = vunpckhpd_avx(auVar59,auVar61);
              auVar59 = vmovlhps_avx(auVar62,auVar64);
              auVar62 = vunpckhpd_avx(auVar62,auVar64);
              pMVar21 = (Mat *)((long)&BT->cstep + lVar41 * 4);
              pMVar21[-1].refcount = (int *)auVar57._0_8_;
              pMVar21[-1].elemsize = auVar57._8_8_;
              pMVar21[-1].elempack = auVar61._0_4_;
              *(int *)&pMVar21[-1].field_0x1c = auVar61._4_4_;
              pMVar21[-1].allocator = (Allocator *)auVar61._8_8_;
              pMVar21[-1].dims = auVar59._0_4_;
              pMVar21[-1].w = auVar59._4_4_;
              pMVar21[-1].h = auVar59._8_4_;
              pMVar21[-1].d = auVar59._12_4_;
              pMVar21[-1].c = auVar62._0_4_;
              *(int *)&pMVar21[-1].field_0x3c = auVar62._4_4_;
              pMVar21[-1].cstep = auVar62._8_8_;
              uVar43 = uVar33 + 4;
              lVar41 = lVar41 + 0x10;
              iVar38 = uVar33 + 7;
              uVar33 = uVar43;
            } while (iVar38 < max_kk);
            BT = (Mat *)&pMVar32->cstep;
            lVar40 = lVar40 + lVar41;
            lVar31 = lVar31 + lVar41;
            lVar29 = lVar29 + lVar41;
            lVar39 = lVar39 + lVar41;
          }
          if ((int)uVar43 < max_kk) {
            lVar41 = 0;
            do {
              *(undefined4 *)&BT->data = *(undefined4 *)(lVar39 + lVar41 * 4);
              *(undefined4 *)((long)&BT->data + 4) = *(undefined4 *)(lVar29 + lVar41 * 4);
              *(undefined4 *)&BT->refcount = *(undefined4 *)(lVar31 + lVar41 * 4);
              *(undefined4 *)((long)&BT->refcount + 4) = *(undefined4 *)(lVar40 + lVar41 * 4);
              BT = (Mat *)&BT->elemsize;
              lVar41 = lVar41 + 1;
            } while (max_kk - uVar43 != (int)lVar41);
          }
        }
      }
      lVar40 = lVar45 + 4;
      lVar31 = lVar45 + 7;
      lVar53 = lVar53 + lVar26;
      lVar23 = lVar23 + lVar26;
      lVar54 = lVar54 + lVar26;
      lVar42 = lVar42 + lVar26;
      lVar45 = lVar40;
    } while (lVar31 < lVar56);
  }
  if ((int)((uint)lVar40 | 1) < max_jj) {
    lVar54 = (long)(int)(uint)lVar40;
    lVar53 = lVar50 * 4 + (lVar54 + lVar47 + 1) * lVar36 * 4;
    lVar23 = lVar50 * 4 + (lVar54 + lVar47) * lVar36 * 4;
    do {
      pvVar25 = B->data;
      if (max_kk < 8) {
        lVar42 = lVar50 * 4 + (lVar54 + lVar47) * lVar36 * 4;
        lVar40 = lVar50 * 4 + (lVar54 + lVar47 + 1) * lVar36 * 4;
        uVar43 = 0;
      }
      else {
        iVar37 = 7;
        lVar42 = 0;
        pMVar21 = BT;
        do {
          pMVar32 = pMVar21;
          auVar3 = *(undefined1 (*) [32])((long)pvVar25 + lVar42 + lVar23);
          auVar58 = *(undefined1 (*) [32])((long)pvVar25 + lVar42 + lVar53);
          auVar60 = vunpcklps_avx(auVar3,auVar58);
          auVar3 = vunpckhps_avx(auVar3,auVar58);
          auVar58._16_16_ = auVar3._0_16_;
          auVar58._0_16_ = auVar60._0_16_;
          auVar3 = vperm2f128_avx(auVar60,auVar3,0x31);
          pauVar27 = (undefined1 (*) [32])((long)&BT->data + lVar42 * 2);
          *pauVar27 = auVar58;
          pauVar27[1] = auVar3;
          lVar42 = lVar42 + 0x20;
          iVar37 = iVar37 + 8;
          pMVar21 = (Mat *)(pauVar27 + 2);
        } while (iVar37 < max_kk);
        BT = (Mat *)&pMVar32->cstep;
        lVar40 = lVar42 + lVar53;
        lVar42 = lVar42 + lVar23;
        uVar43 = max_kk & 0xfffffff8;
      }
      pauVar48 = (undefined1 (*) [16])((long)pvVar25 + lVar42);
      pauVar28 = (undefined1 (*) [16])((long)pvVar25 + lVar40);
      uVar33 = uVar43 | 3;
      while ((int)uVar33 < max_kk) {
        auVar59 = vunpcklps_avx(*pauVar48,*pauVar28);
        auVar57 = vunpckhps_avx(*pauVar48,*pauVar28);
        BT->data = (void *)auVar59._0_8_;
        BT->refcount = (int *)auVar59._8_8_;
        BT->elemsize = auVar57._0_8_;
        BT->elempack = auVar57._8_4_;
        *(int *)&BT->field_0x1c = auVar57._12_4_;
        BT = (Mat *)&BT->allocator;
        pauVar48 = pauVar48 + 1;
        pauVar28 = pauVar28 + 1;
        uVar33 = uVar43 + 7;
        uVar43 = uVar43 + 4;
      }
      if ((int)uVar43 < max_kk) {
        lVar40 = 0;
        do {
          *(undefined4 *)&BT->data = *(undefined4 *)(*pauVar48 + lVar40 * 4);
          *(undefined4 *)((long)&BT->data + 4) = *(undefined4 *)(*pauVar28 + lVar40 * 4);
          BT = (Mat *)&BT->refcount;
          lVar40 = lVar40 + 1;
        } while (max_kk - uVar43 != (int)lVar40);
      }
      lVar40 = lVar54 + 2;
      lVar42 = lVar54 + 3;
      lVar53 = lVar53 + lVar36 * 8;
      lVar23 = lVar23 + lVar36 * 8;
      lVar54 = lVar40;
    } while (lVar42 < lVar56);
  }
  if ((int)lVar40 < max_jj) {
    lVar40 = (long)(int)lVar40;
    do {
      pauVar27 = (undefined1 (*) [32])((long)B->data + lVar50 * 4 + (lVar40 + lVar47) * lVar36 * 4);
      if (max_kk < 8) {
        uVar43 = 0;
      }
      else {
        iVar37 = 7;
        do {
          *(undefined1 (*) [32])BT = *pauVar27;
          BT = (Mat *)&BT->allocator;
          pauVar27 = pauVar27 + 1;
          iVar37 = iVar37 + 8;
          uVar43 = max_kk & 0xfffffff8;
        } while (iVar37 < max_kk);
      }
      uVar33 = uVar43 | 3;
      while ((int)uVar33 < max_kk) {
        uVar20 = *(undefined8 *)((long)pauVar27 + 8);
        BT->data = (void *)*(undefined8 *)((long)pauVar27 + 0);
        BT->refcount = (int *)uVar20;
        BT = (Mat *)&BT->elemsize;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
        uVar33 = uVar43 + 7;
        uVar43 = uVar43 + 4;
      }
      if ((int)uVar43 < max_kk) {
        lVar53 = 0;
        lVar23 = 0;
        do {
          *(undefined4 *)((long)&BT->data + lVar23 * 4) = *(undefined4 *)(*pauVar27 + lVar23 * 4);
          lVar23 = lVar23 + 1;
          lVar53 = lVar53 + -4;
        } while (max_kk - uVar43 != (int)lVar23);
        BT = (Mat *)((long)BT - lVar53);
      }
      lVar40 = lVar40 + 1;
    } while (lVar40 != lVar56);
  }
  return;
}

Assistant:

static void pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 8));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 12));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + ((j + jj) / 8 * 8 + 8) * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;
            const float* p2 = (const float*)B + (j + jj + 8) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                pp += 12;
                p0 += 4;
                p1 += 4;
                p2 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;
            const float* p8 = (const float*)B + (j + jj + 8) * B_hstep + k;
            const float* p9 = (const float*)B + (j + jj + 9) * B_hstep + k;
            const float* pa = (const float*)B + (j + jj + 10) * B_hstep + k;
            const float* pb = (const float*)B + (j + jj + 11) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                __m256 _r8 = _mm256_loadu_ps(p8);
                __m256 _r9 = _mm256_loadu_ps(p9);
                __m256 _ra = _mm256_loadu_ps(pa);
                __m256 _rb = _mm256_loadu_ps(pb);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                _mm256_storeu_ps(pp + 8 * 8, _r8);
                _mm256_storeu_ps(pp + 8 * 9, _r9);
                _mm256_storeu_ps(pp + 8 * 10, _ra);
                _mm256_storeu_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
                p8 += 8;
                p9 += 8;
                pa += 8;
                pb += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                __m128 _r8 = _mm_loadu_ps(p8);
                __m128 _r9 = _mm_loadu_ps(p9);
                __m128 _ra = _mm_loadu_ps(pa);
                __m128 _rb = _mm_loadu_ps(pb);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
                p8 += 4;
                p9 += 4;
                pa += 4;
                pb += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp += 12;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + (j + jj + 8) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 8));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    pp += 4;
                    p0 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 16, _r2);
                _mm256_storeu_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}